

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_ParsePsbt_Test::TestBody(Psbt_ParsePsbt_Test *this)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_3;
  CfdException *except;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Psbt from_b64;
  ScopedTrace gtest_trace_794;
  CfdPsbtTestData *data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CfdPsbtTestData,_std::allocator<CfdPsbtTestData>_> *__range1;
  vector<CfdPsbtTestData,_std::allocator<CfdPsbtTestData>_> *in_stack_fffffffffffffdb8;
  Psbt *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  reference in_stack_fffffffffffffe10;
  string *file;
  ScopedTrace *in_stack_fffffffffffffe20;
  AssertHelper local_1b8;
  Message local_1b0;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  string local_188 [32];
  AssertionResult local_168;
  AssertHelper local_158;
  Message local_150 [4];
  string local_130 [32];
  AssertionResult local_110;
  Psbt local_100;
  string local_70 [32];
  string local_50 [39];
  ScopedTrace local_29;
  reference local_28;
  CfdPsbtTestData *local_20;
  __normal_iterator<const_CfdPsbtTestData_*,_std::vector<CfdPsbtTestData,_std::allocator<CfdPsbtTestData>_>_>
  local_18;
  vector<CfdPsbtTestData,_std::allocator<CfdPsbtTestData>_> *local_10;
  
  local_10 = &g_cfd_psbt_testdata;
  local_18._M_current =
       (CfdPsbtTestData *)
       std::vector<CfdPsbtTestData,_std::allocator<CfdPsbtTestData>_>::begin
                 (in_stack_fffffffffffffdb8);
  local_20 = (CfdPsbtTestData *)
             std::vector<CfdPsbtTestData,_std::allocator<CfdPsbtTestData>_>::end
                       (in_stack_fffffffffffffdb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_CfdPsbtTestData_*,_std::vector<CfdPsbtTestData,_std::allocator<CfdPsbtTestData>_>_>
                             *)in_stack_fffffffffffffdc0,
                            (__normal_iterator<const_CfdPsbtTestData_*,_std::vector<CfdPsbtTestData,_std::allocator<CfdPsbtTestData>_>_>
                             *)in_stack_fffffffffffffdb8), bVar1) {
    local_28 = __gnu_cxx::
               __normal_iterator<const_CfdPsbtTestData_*,_std::vector<CfdPsbtTestData,_std::allocator<CfdPsbtTestData>_>_>
               ::operator*(&local_18);
    file = local_70;
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                   in_stack_fffffffffffffe00);
    std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
    testing::ScopedTrace::ScopedTrace
              (in_stack_fffffffffffffe20,(char *)file,
               (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
               (string *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    cfd::Psbt::Psbt(&local_100,(string *)&local_28->base64);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1a8,"\"The current test should generate an error.\"",
                 "data.hex.c_str()","The current test should generate an error.",pcVar3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
      if (!bVar1) {
        testing::Message::Message(&local_1b0);
        in_stack_fffffffffffffdd8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x25569b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                   ,0x321,in_stack_fffffffffffffdd8);
        testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_1b8);
        testing::Message::~Message((Message *)0x2556f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x25574d);
    }
    else {
      in_stack_fffffffffffffe10 = local_28;
      cfd::core::Psbt::GetData();
      cfd::core::ByteData::GetHex_abi_cxx11_();
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_130);
      cfd::core::ByteData::~ByteData((ByteData *)0x255286);
      in_stack_fffffffffffffe0f = testing::AssertionResult::operator_cast_to_bool(&local_110);
      if (!(bool)in_stack_fffffffffffffe0f) {
        testing::Message::Message(local_150);
        in_stack_fffffffffffffe00 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x2553a4);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                   ,0x31e,(char *)in_stack_fffffffffffffe00);
        testing::internal::AssertHelper::operator=(&local_158,local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        testing::Message::~Message((Message *)0x255401);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x255459);
      cfd::core::Psbt::GetBase64_abi_cxx11_();
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_188);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
      if (!bVar1) {
        testing::Message::Message(&local_190);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x255547);
        testing::internal::AssertHelper::AssertHelper
                  (&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                   ,799,pcVar3);
        testing::internal::AssertHelper::operator=(&local_198,&local_190);
        testing::internal::AssertHelper::~AssertHelper(&local_198);
        testing::Message::~Message((Message *)0x2555a4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x2555f9);
    }
    cfd::Psbt::~Psbt(in_stack_fffffffffffffdc0);
    testing::ScopedTrace::~ScopedTrace(&local_29);
    __gnu_cxx::
    __normal_iterator<const_CfdPsbtTestData_*,_std::vector<CfdPsbtTestData,_std::allocator<CfdPsbtTestData>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

TEST(Psbt, ParsePsbt) {
  for (const auto& data : g_cfd_psbt_testdata) {
    {
      SCOPED_TRACE("hex[" + data.hex + "]");
      try {
        Psbt from_b64(data.base64);
        if (data.error_message.empty()) {
          EXPECT_EQ(data.hex, from_b64.GetData().GetHex());
          EXPECT_EQ(data.base64, from_b64.GetBase64());
        } else {
          EXPECT_STREQ("The current test should generate an error.", data.hex.c_str());
        }
      } catch (const CfdException& except) {
        EXPECT_STREQ(data.error_message.c_str(), except.what());
      }
    }
  }
}